

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCMakeHostSystemInformationCommand.cxx
# Opt level: O1

bool __thiscall
cmCMakeHostSystemInformationCommand::InitialPass
          (cmCMakeHostSystemInformationCommand *this,
          vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *args,cmExecutionStatus *param_2)

{
  pointer pcVar1;
  long lVar2;
  cmCMakeHostSystemInformationCommand *this_00;
  bool bVar3;
  int iVar4;
  pointer pbVar5;
  ulong uVar6;
  long lVar7;
  bool bVar8;
  SystemInformation info;
  string result_list;
  string variable;
  string value;
  string key;
  SystemInformation local_c0;
  string local_b8;
  string local_98;
  string local_78;
  string local_58;
  cmCMakeHostSystemInformationCommand *local_38;
  
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) < 0x21) ||
     (iVar4 = std::__cxx11::string::compare((char *)pbVar5), iVar4 != 0)) {
    local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_98,"missing RESULT specification.","");
    cmCommand::SetError(&this->super_cmCommand,&local_98);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_98._M_dataplus._M_p != &local_98.field_2) {
      operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
    }
    return false;
  }
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  local_98._M_dataplus._M_p = (pointer)&local_98.field_2;
  pcVar1 = pbVar5[1]._M_dataplus._M_p;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_98,pcVar1,pcVar1 + pbVar5[1]._M_string_length);
  pbVar5 = (args->
           super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
           )._M_impl.super__Vector_impl_data._M_start;
  if (((ulong)((long)(args->
                     super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) < 0x80) ||
     (iVar4 = std::__cxx11::string::compare((char *)(pbVar5 + 2)), iVar4 != 0)) {
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_b8,"missing QUERY specification","");
    cmCommand::SetError(&this->super_cmCommand,&local_b8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    bVar8 = false;
  }
  else {
    cmsys::SystemInformation::SystemInformation(&local_c0);
    cmsys::SystemInformation::RunCPUCheck(&local_c0);
    cmsys::SystemInformation::RunOSCheck(&local_c0);
    cmsys::SystemInformation::RunMemoryCheck(&local_c0);
    local_b8._M_dataplus._M_p = (pointer)&local_b8.field_2;
    local_b8._M_string_length = 0;
    local_b8.field_2._M_local_buf[0] = '\0';
    pbVar5 = (args->
             super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             )._M_impl.super__Vector_impl_data._M_start;
    bVar8 = (ulong)((long)(args->
                          super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5) < 0x80;
    if (!bVar8) {
      uVar6 = 3;
      lVar7 = 0x68;
      local_38 = this;
      do {
        this_00 = local_38;
        local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
        lVar2 = *(long *)((long)pbVar5 + lVar7 + -8);
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_58,lVar2,
                   *(long *)((long)&(pbVar5->_M_dataplus)._M_p + lVar7) + lVar2);
        if (uVar6 != 3) {
          std::__cxx11::string::append((char *)&local_b8);
        }
        local_78._M_dataplus._M_p = (pointer)&local_78.field_2;
        local_78._M_string_length = 0;
        local_78.field_2._M_local_buf[0] = '\0';
        bVar3 = GetValue(this_00,&local_c0,&local_58,&local_78);
        if (!bVar3) {
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_78._M_dataplus._M_p != &local_78.field_2) {
            operator_delete(local_78._M_dataplus._M_p,
                            CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                     local_78.field_2._M_local_buf[0]) + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_58._M_dataplus._M_p != &local_58.field_2) {
            operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
          }
          goto LAB_00320e4a;
        }
        std::__cxx11::string::_M_append((char *)&local_b8,(ulong)local_78._M_dataplus._M_p);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_78._M_dataplus._M_p != &local_78.field_2) {
          operator_delete(local_78._M_dataplus._M_p,
                          CONCAT71(local_78.field_2._M_allocated_capacity._1_7_,
                                   local_78.field_2._M_local_buf[0]) + 1);
        }
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_58._M_dataplus._M_p != &local_58.field_2) {
          operator_delete(local_58._M_dataplus._M_p,local_58.field_2._M_allocated_capacity + 1);
        }
        if (!bVar3) goto LAB_00320e4a;
        uVar6 = uVar6 + 1;
        pbVar5 = (args->
                 super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_start;
        lVar7 = lVar7 + 0x20;
        bVar3 = uVar6 < (ulong)((long)(args->
                                      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                      )._M_impl.super__Vector_impl_data._M_finish - (long)pbVar5 >>
                               5);
        bVar8 = !bVar3;
        this = local_38;
      } while (bVar3);
    }
    cmMakefile::AddDefinition((this->super_cmCommand).Makefile,&local_98,local_b8._M_dataplus._M_p);
LAB_00320e4a:
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_b8._M_dataplus._M_p != &local_b8.field_2) {
      operator_delete(local_b8._M_dataplus._M_p,
                      CONCAT71(local_b8.field_2._M_allocated_capacity._1_7_,
                               local_b8.field_2._M_local_buf[0]) + 1);
    }
    cmsys::SystemInformation::~SystemInformation(&local_c0);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_98._M_dataplus._M_p == &local_98.field_2) {
    return bVar8;
  }
  operator_delete(local_98._M_dataplus._M_p,local_98.field_2._M_allocated_capacity + 1);
  return bVar8;
}

Assistant:

bool cmCMakeHostSystemInformationCommand
::InitialPass(std::vector<std::string> const &args, cmExecutionStatus &)
{
  size_t current_index = 0;

  if(args.size() < (current_index + 2) || args[current_index] != "RESULT")
    {
    this->SetError("missing RESULT specification.");
    return false;
    }

  std::string variable = args[current_index + 1];
  current_index += 2;

  if(args.size() < (current_index + 2) || args[current_index] != "QUERY")
    {
    this->SetError("missing QUERY specification");
    return false;
    }

  cmsys::SystemInformation info;
  info.RunCPUCheck();
  info.RunOSCheck();
  info.RunMemoryCheck();

  std::string result_list;
  for(size_t i = current_index + 1; i < args.size(); ++i)
    {
    std::string key = args[i];
    if(i != current_index + 1)
      {
      result_list += ";";
      }
    std::string value;
    if(!this->GetValue(info, key, value)) return false;

    result_list += value;
    }

  this->Makefile->AddDefinition(variable, result_list.c_str());

  return true;
}